

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O2

collision_object_ptr __thiscall
APhyBullet::BulletCollisionObject::getOverlappingObject(BulletCollisionObject *this,aphy_size index)

{
  long lVar1;
  long lVar2;
  
  if (((this->type - GhostObject < 2) &&
      (lVar1 = *(long *)(*(long *)(this->handle[1].m_worldTransform.m_basis.m_el[0].m_floats + 2) +
                        (long)(int)index * 8), lVar1 != 0)) &&
     (lVar1 = *(long *)(lVar1 + 0x108), lVar1 != 0)) {
    lVar2 = *(long *)(lVar1 + 8);
    if ((lVar2 != 0) && (*(int *)(lVar2 + 0x10) != 0)) {
      LOCK();
      *(int *)(lVar2 + 0x10) = *(int *)(lVar2 + 0x10) + 1;
      UNLOCK();
    }
    return *(collision_object_ptr *)(lVar1 + 8);
  }
  return (collision_object_ptr)0x0;
}

Assistant:

collision_object_ptr BulletCollisionObject::getOverlappingObject(aphy_size index)
{
    if(!isGhostObjectType(type))
        return nullptr;

    auto object = static_cast<btGhostObject*> (handle)->getOverlappingObject(index);
    if(!object)
        return nullptr;

    auto objectWrapper = reinterpret_cast<BulletCollisionObject*> (object->getUserPointer());
    if(!objectWrapper)
        return nullptr;

    return objectWrapper->refFromThis<aphy::collision_object> ().disownedNewRef();
}